

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall
CVmConsole::open_script_file
          (CVmConsole *this,CVmNetFile *nf,vm_val_t *filespec,int quiet,int script_more_mode)

{
  script_stack_entry *encp;
  int iVar1;
  int old_more;
  FILE *__stream;
  char *pcVar2;
  script_stack_entry *this_00;
  ulong uVar3;
  int local_78;
  char buf [50];
  
  iVar1 = 1;
  if (nf != (CVmNetFile *)0x0) {
    uVar3 = (ulong)(uint)script_more_mode;
    __stream = fopen(nf->lclfname,"r");
    if (__stream == (FILE *)0x0) {
      CVmNetFile::abandon(nf);
    }
    else {
      pcVar2 = fgets(buf,0x32,__stream);
      if ((pcVar2 == (char *)0x0) || (iVar1 = bcmp(buf,"<eventscript>\n",0xf), iVar1 != 0)) {
        local_78 = 0;
        fseek(__stream,0,0);
      }
      else {
        local_78 = 1;
      }
      encp = this->script_sp_;
      iVar1 = quiet;
      if (encp != (script_stack_entry *)0x0) {
        iVar1 = 1;
        if (encp->quiet == 0) {
          iVar1 = quiet;
        }
        if (encp->more_mode == 0) {
          uVar3 = 0;
        }
      }
      this_00 = (script_stack_entry *)operator_new(0x30);
      old_more = (*this->_vptr_CVmConsole[4])(this,uVar3);
      script_stack_entry::script_stack_entry
                (this_00,encp,old_more,nf,(osfildef *)__stream,filespec,(int)uVar3,iVar1,local_78);
      this->script_sp_ = this_00;
      iVar1 = 0;
      if ((int)uVar3 == 0) {
        os_nonstop_mode(1);
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int CVmConsole::open_script_file(VMG_ CVmNetFile *nf, const vm_val_t *filespec,
                                 int quiet, int script_more_mode)
{
    int evt;
    char buf[50];
    
    /* if the network file open failed, return an error */
    if (nf == 0)
        return 1;

    /* open the local file */
    osfildef *fp = osfoprt(nf->lclfname, OSFTCMD);

    /* if that failed, silently ignore the request */
    if (fp == 0)
    {
        /* abandon the network file descriptor and return failure */
        nf->abandon(vmg0_);
        return 1;
    }

    /* read the first line to see if it looks like an event script */
    if (osfgets(buf, sizeof(buf), fp) != 0
        && strcmp(buf, "<eventscript>\n") == 0)
    {
        /* remember that it's an event script */
        evt = TRUE;
    }
    else
    {
        /* 
         *   it's not an event script, so it must be a regular command-line
         *   script - rewind it so we read the first line again as a regular
         *   input line 
         */
        evt = FALSE;
        osfseek(fp, 0, OSFSK_SET);
    }

    /* if there's an enclosing script, inherit its modes */
    if (script_sp_ != 0)
    {
        /* 
         *   if the enclosing script is quiet, force the nested script to be
         *   quiet as well 
         */
        if (script_sp_->quiet)
            quiet = TRUE;

        /* 
         *   if the enclosing script is nonstop, force the nested script to
         *   be nonstop as well
         */
        if (!script_sp_->more_mode)
            script_more_mode = FALSE;
    }

    /* push the new script file onto the stack */
    script_sp_ = new script_stack_entry(
        vmg_ script_sp_, set_more_state(script_more_mode), nf, fp, filespec,
        script_more_mode, quiet, evt);
    
    /* turn on NONSTOP mode in the OS layer if applicable */
    if (!script_more_mode)
        os_nonstop_mode(TRUE);

    /* success */
    return 0;
}